

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn2.hpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
trng::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,yarn2 *R)

{
  long lVar1;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var2;
  ostream *poVar3;
  char *pcVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  basic_ostream<char,_std::char_traits<char>_> *in_RSI;
  ostream *in_RDI;
  fmtflags flags;
  undefined4 in_stack_ffffffffffffffe8;
  
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  lVar1 = *(long *)(*(long *)in_RDI + -0x18);
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)(in_RDI + lVar1),_Var2);
  poVar3 = std::operator<<(in_RDI,'[');
  pcVar4 = yarn2::name();
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::operator<<(poVar3,' ');
  pbVar5 = operator<<(in_RSI,(mrg_parameter<int,_2,_trng::yarn2> *)
                             CONCAT44(__fmtfl,in_stack_ffffffffffffffe8));
  std::operator<<((ostream *)pbVar5,' ');
  pbVar5 = operator<<(in_RSI,(mrg_status<int,_2,_trng::yarn2> *)
                             CONCAT44(__fmtfl,in_stack_ffffffffffffffe8));
  std::operator<<((ostream *)pbVar5,']');
  Catch::clara::std::ios_base::flags
            ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)),__fmtfl);
  return (basic_ostream<char,_std::char_traits<char>_> *)in_RDI;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
        std::basic_ostream<char_t, traits_t> &out, const yarn2 &R) {
      std::ios_base::fmtflags flags(out.flags());
      out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      out << '[' << yarn2::name() << ' ' << R.P << ' ' << R.S << ']';
      out.flags(flags);
      return out;
    }